

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O2

void al_color_lab_to_rgb(float l,float a,float b,float *red,float *green,float *blue)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_8_ = (double)l + 0.16;
  auVar4._8_8_ = (double)a;
  auVar4 = divpd(auVar4,_DAT_001042e0);
  dVar3 = auVar4._0_8_;
  dVar1 = auVar4._8_8_ + dVar3;
  if (dVar1 <= 0.20689655172413793) {
    dVar1 = (dVar1 + -0.13793103448275862) * 3.0 * 0.04280618311533888;
  }
  else {
    dVar1 = pow(dVar1,3.0);
  }
  if (dVar3 <= 0.20689655172413793) {
    dVar2 = (dVar3 + -0.13793103448275862) * 3.0 * 0.04280618311533888;
  }
  else {
    dVar2 = pow(dVar3,3.0);
  }
  dVar3 = (double)b * -0.5 + dVar3;
  if (dVar3 <= 0.20689655172413793) {
    dVar3 = (dVar3 + -0.13793103448275862) * 3.0 * 0.04280618311533888;
  }
  else {
    dVar3 = pow(dVar3,3.0);
  }
  al_color_xyz_to_rgb((float)(dVar1 * 0.95047),(float)dVar2,(float)(dVar3 * 1.08883),red,green,blue)
  ;
  return;
}

Assistant:

void al_color_lab_to_rgb(float l, float a, float b,
    float *red, float *green, float *blue)
{
   float x = Xn * cielab_f_inv((l + 0.16) / 1.16 + a / 5.00);
   float y = Yn * cielab_f_inv((l + 0.16) / 1.16);
   float z = Zn * cielab_f_inv((l + 0.16) / 1.16 - b / 2.00);
   al_color_xyz_to_rgb(x, y, z, red, green, blue);
}